

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O1

ABC_Manager ABC_InitManager(void)

{
  ABC_Manager __s;
  Abc_Ntk_t *pAVar1;
  char *pcVar2;
  stmm_table *psVar3;
  Mem_Flex_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  
  Abc_Start();
  __s = (ABC_Manager)malloc(0xb0);
  memset(__s,0,0xb0);
  pAVar1 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  __s->pNtk = pAVar1;
  pcVar2 = Extra_UtilStrsav("csat_network");
  __s->pNtk->pName = pcVar2;
  psVar3 = stmm_init_table(strcmp,stmm_strhash);
  __s->tName2Node = psVar3;
  psVar3 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  __s->tNode2Name = psVar3;
  pMVar4 = Mem_FlexStart();
  __s->pMmNames = pMVar4;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  __s->vNodes = pVVar5;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  __s->vValues = pVVar7;
  __s->mode = 0;
  Prove_ParamsSetDefault(&__s->Params);
  return __s;
}

Assistant:

ABC_Manager ABC_InitManager()
{
    ABC_Manager_t * mng;
    Abc_Start();
    mng = ABC_ALLOC( ABC_Manager_t, 1 );
    memset( mng, 0, sizeof(ABC_Manager_t) );
    mng->pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    mng->pNtk->pName = Extra_UtilStrsav("csat_network");
    mng->tName2Node = stmm_init_table(strcmp, stmm_strhash);
    mng->tNode2Name = stmm_init_table(stmm_ptrcmp, stmm_ptrhash);
    mng->pMmNames   = Mem_FlexStart();
    mng->vNodes     = Vec_PtrAlloc( 100 );
    mng->vValues    = Vec_IntAlloc( 100 );
    mng->mode       = 0; // set "resource-aware integration" as the default mode
    // set default parameters for CEC
    Prove_ParamsSetDefault( &mng->Params );
    // set infinite resource limit for the final mitering
//    mng->Params.nMiteringLimitLast = ABC_INFINITY;
    return mng;
}